

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_binder.cpp
# Opt level: O2

disp_binding_activator_t * __thiscall
so_5::impl::pre5_5_19_default_disp_binder_t::bind_agent
          (disp_binding_activator_t *__return_storage_ptr__,pre5_5_19_default_disp_binder_t *this,
          environment_t *env,agent_ref_t *agent)

{
  _func_int **pp_Var1;
  disp_binder_t *pdVar2;
  environment_t local_38;
  
  spinlock_t<so_5::yield_backoff_t>::lock(&this->m_lock);
  pdVar2 = (this->m_actual_binder)._M_t.
           super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>.
           _M_t.
           super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>.
           super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl;
  if (pdVar2 == (disp_binder_t *)0x0) {
    environment_t::so_make_default_disp_binder(&local_38);
    pp_Var1 = local_38._vptr_environment_t;
    local_38._vptr_environment_t = (_func_int **)0x0;
    pdVar2 = (this->m_actual_binder)._M_t.
             super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>.
             _M_t.
             super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>
             .super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl;
    (this->m_actual_binder)._M_t.
    super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>._M_t.
    super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>.
    super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl = (disp_binder_t *)pp_Var1;
    if (pdVar2 != (disp_binder_t *)0x0) {
      (*pdVar2->_vptr_disp_binder_t[1])();
      if ((disp_binder_t *)local_38._vptr_environment_t != (disp_binder_t *)0x0) {
        (*(*(_func_int ***)local_38._vptr_environment_t)[1])();
      }
    }
    pdVar2 = (this->m_actual_binder)._M_t.
             super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>.
             _M_t.
             super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>
             .super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl;
  }
  (this->m_lock).m_flag.super___atomic_flag_base._M_i = false;
  local_38.m_impl._M_t.
  super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
  .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl =
       (__uniq_ptr_data<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>,_true,_true>
        )agent->m_obj;
  agent->m_obj = (agent_t *)0x0;
  (*pdVar2->_vptr_disp_binder_t[2])(__return_storage_ptr__,pdVar2,env);
  intrusive_ptr_t<so_5::agent_t>::~intrusive_ptr_t
            ((intrusive_ptr_t<so_5::agent_t> *)&local_38.m_impl);
  return __return_storage_ptr__;
}

Assistant:

virtual disp_binding_activator_t
		bind_agent(
			environment_t & env,
			agent_ref_t agent ) override
			{
				// Actual binder must be created if necessary.
				{
					std::lock_guard< default_spinlock_t > lock( m_lock );
					if( !m_actual_binder )
						m_actual_binder = env.so_make_default_disp_binder();
				}
				return m_actual_binder->bind_agent( env, std::move(agent) );
			}